

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

Var __thiscall Js::InterpreterStackFrame::DebugProcess(InterpreterStackFrame *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  bool skipException;
  JavascriptExceptionObject *exception_;
  JavascriptException *err;
  JavascriptExceptionObject *exception;
  InterpreterStackFrame *this_local;
  
  if (*(long *)(this + 0x98) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x9c8,"(this->returnAddress != nullptr)",
                                "this->returnAddress != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = ScriptContext::ShouldPerformRecordOrReplayDebuggerAction(*(ScriptContext **)(this + 0x78))
  ;
  if (bVar2) {
    this_local = (InterpreterStackFrame *)ProcessWithDebugging_PreviousStmtTracking(this);
  }
  else {
    this_local = (InterpreterStackFrame *)ProcessWithDebugging(this);
  }
  return this_local;
}

Assistant:

Var InterpreterStackFrame::DebugProcess()
    {
        Assert(this->returnAddress != nullptr);
        while (true)
        {
            JavascriptExceptionObject *exception = nullptr;
            try
            {
#if ENABLE_TTD
                if (SHOULD_DO_TTD_STACK_STMT_OP(this->scriptContext))
                {
                    return this->ProcessWithDebugging_PreviousStmtTracking();
                }
                else
                {
                    return this->ProcessWithDebugging();
                }
#else
                return this->ProcessWithDebugging();
#endif
            }
            catch (const Js::JavascriptException& err)
            {
                JavascriptExceptionObject *exception_ = err.GetAndClear();
                Assert(exception_);
                exception = exception_;
            }

            if (exception)
            {
                bool skipException = false;
                if (exception != scriptContext->GetThreadContext()->GetPendingSOErrorObject() &&
                    exception != scriptContext->GetThreadContext()->GetPendingOOMErrorObject())
                {
                    skipException = exception->IsDebuggerSkip();
                }
                if (skipException)
                {
                    // If we are going to swallow the exception then advance to the beginning of the next user statement
                    if (exception->IsIgnoreAdvanceToNextStatement()
                        || this->scriptContext->GetDebugContext()->GetProbeContainer()->AdvanceToNextUserStatement(this->m_functionBody, &this->m_reader))
                    {
                        // We must fix up the return value to at least be undefined:
                        this->SetReg((RegSlot)0, this->scriptContext->GetLibrary()->GetUndefined());

                        // If we recover from the exception, there may be a chance the out pointers in the InterpreterStackframe are not in a proper state.
                        // Reset them to correct the stack.
                        ResetOut();

                        // If we can successfully advance then continuing processing
                        continue;
                    }
                }

                JavascriptExceptionOperators::DoThrowCheckClone(exception, scriptContext);
            }
        }
    }